

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlspwin.c
# Opt level: O0

void Create_LispWindow(DspInterface dsp)

{
  int iVar1;
  Window WVar2;
  GC p_Var3;
  Pixmap PVar4;
  undefined8 in_stack_fffffffffffffda8;
  uint uVar8;
  XID *pXVar5;
  unsigned_long uVar6;
  undefined8 uVar7;
  undefined4 uVar9;
  char *local_230;
  char *IT;
  char *WT;
  int local_218;
  uint GravSize;
  uint Row3;
  uint Col3;
  uint Row2;
  uint Col2;
  Screen *screen;
  XGCValues gcv;
  XSetWindowAttributes Lisp_SetWinAttributes;
  XTextProperty WindowNameText;
  XTextProperty IconText;
  XClassHint xclasshint;
  XWMHints Lisp_WMhints;
  XSizeHints szhint;
  unsigned_long uStack_30;
  int status;
  XColor backgroundColor_xcsd;
  XColor foregroundColor_xcsd;
  DspInterface dsp_local;
  
  uVar8 = (uint)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  memset(&Lisp_WMhints.window_group,0,0x50);
  memset(&xclasshint.res_class,0,0x38);
  memset(&IconText.nitems,0,0x10);
  memset(&WindowNameText.nitems,0,0x20);
  memset(&Lisp_SetWinAttributes.cursor,0,0x20);
  memset(&gcv.dash_offset,0,0x70);
  memset(&screen,0,0x80);
  IT = windowTitle;
  local_230 = iconTitle;
  WT._4_4_ = (dsp->ScrollBarWidth >> 1) - dsp->InternalBorderWidth;
  Col3 = (dsp->Visible).width;
  Row3 = (dsp->Visible).height;
  GravSize = (dsp->Visible).width + (dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2 >> 1);
  local_218 = (dsp->Visible).height + (dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2 >> 1);
  _Row2 = *(long *)(dsp->display_id + 0xe8) + (long)*(int *)(dsp->display_id + 0xe0) * 0x80;
  foregroundPixel = *(unsigned_long *)(_Row2 + 0x60);
  backgroundPixel = *(unsigned_long *)(_Row2 + 0x58);
  if (foregroundColorName[0] != '\0') {
    iVar1 = XAllocNamedColor(dsp->display_id,Colors,foregroundColorName,&backgroundColor_xcsd.red);
    if (iVar1 == 0) {
      fprintf(_stderr,"Color allocation failed for foreground color: %s\n",foregroundColorName);
      exit(1);
    }
    foregroundPixel._0_2_ = backgroundColor_xcsd.red;
    foregroundPixel._2_2_ = backgroundColor_xcsd.green;
    foregroundPixel._4_2_ = backgroundColor_xcsd.blue;
    foregroundPixel._6_1_ = backgroundColor_xcsd.flags;
    foregroundPixel._7_1_ = backgroundColor_xcsd.pad;
  }
  if (backgroundColorName[0] != '\0') {
    iVar1 = XAllocNamedColor(dsp->display_id,Colors,backgroundColorName,&stack0xffffffffffffffd0);
    if (iVar1 == 0) {
      fprintf(_stderr,"Color allocation failed for background color: %s\n",backgroundColorName);
      exit(1);
    }
    backgroundPixel = uStack_30;
  }
  WVar2 = XCreateSimpleWindow(dsp->display_id,*(undefined8 *)(_Row2 + 0x10),LispWindowRequestedX,
                              LispWindowRequestedY,
                              (dsp->Visible).width +
                              dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2,
                              (dsp->Visible).height +
                              dsp->ScrollBarWidth + dsp->InternalBorderWidth * 2,
                              (ulong)uVar8 << 0x20,foregroundPixel,backgroundPixel);
  dsp->LispWindow = WVar2;
  Lisp_SetWinAttributes.border_pixel._0_4_ = dsp->BitGravity;
  Lisp_SetWinAttributes.do_not_propagate_mask._0_4_ = 0;
  Lisp_SetWinAttributes.bit_gravity = *(int *)(_Row2 + 0x70);
  XChangeWindowAttributes(dsp->display_id,dsp->LispWindow,0x210,&gcv.dash_offset);
  dsp->DisableEventMask = 0;
  dsp->EnableEventMask = 0x2807f;
  screen._0_4_ = 3;
  gcv.plane_mask = foregroundPixel;
  gcv.foreground = backgroundPixel;
  p_Var3 = (GC)XCreateGC(dsp->display_id,dsp->LispWindow,0xd,&screen);
  dsp->Copy_GC = p_Var3;
  Lisp_WMhints.window_group = 0x228;
  Lisp_WMhints._8_8_ = make_Xicon(dsp);
  Lisp_WMhints.flags._0_4_ = 1;
  xclasshint.res_class = (char *)0x5;
  IconText.nitems = (unsigned_long)*save_argv;
  xclasshint.res_name = *save_argv;
  XStringListToTextProperty(&IT,1,&Lisp_SetWinAttributes.cursor);
  XStringListToTextProperty(&local_230,1,&WindowNameText.nitems);
  pXVar5 = &Lisp_WMhints.window_group;
  XSetWMProperties(dsp->display_id,dsp->LispWindow,&Lisp_SetWinAttributes.cursor,
                   &WindowNameText.nitems,save_argv,save_argc,pXVar5,&xclasshint.res_class,
                   &IconText.nitems);
  XSelectInput(dsp->display_id,dsp->LispWindow,dsp->EnableEventMask);
  init_Xcursor(dsp);
  uVar6 = foregroundPixel;
  WVar2 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,0,0,(dsp->Visible).width,
                              (dsp->Visible).height,(ulong)pXVar5 & 0xffffffff00000000,
                              foregroundPixel,backgroundPixel);
  uVar9 = (undefined4)(uVar6 >> 0x20);
  dsp->DisplayWindow = WVar2;
  XChangeWindowAttributes(dsp->display_id,dsp->DisplayWindow,0x250,&gcv.dash_offset);
  XSelectInput(dsp->display_id,dsp->DisplayWindow,dsp->EnableEventMask);
  XMapWindow(dsp->display_id,dsp->DisplayWindow);
  PVar4 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,check_bits,check_width,check_height,
                     foregroundPixel,backgroundPixel,CONCAT44(uVar9,*(undefined4 *)(_Row2 + 0x38)));
  dsp->ScrollBarPixmap = PVar4;
  PVar4 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,check_bits,0x10,0x10,foregroundPixel,
                     backgroundPixel,*(undefined4 *)(_Row2 + 0x38));
  dsp->GravityOnPixmap = PVar4;
  uVar6 = backgroundPixel;
  PVar4 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,plain_bits,0x10,0x10,foregroundPixel,
                     backgroundPixel,*(undefined4 *)(_Row2 + 0x38));
  uVar9 = (undefined4)(uVar6 >> 0x20);
  dsp->GravityOffPixmap = PVar4;
  set_Xcursor(dsp,defaultcursor_bitmap,0,0,&DefaultCursor,0);
  set_Xcursor(dsp,waitcursor_bitmap,7,7,&WaitCursor,0);
  set_Xcursor(dsp,scrolldowncursor_bitmap,7,0,&ScrollDownCursor,0);
  set_Xcursor(dsp,"",8,10,&ScrollLeftCursor,0);
  set_Xcursor(dsp,"\x01",7,0,&VertScrollCursor,0);
  set_Xcursor(dsp,"",8,7,&VertThumbCursor,0);
  set_Xcursor(dsp,"",7,10,&HorizScrollCursor,0);
  set_Xcursor(dsp,"",6,7,&HorizThumbCursor,0);
  set_Xcursor(dsp,"",7,10,&ScrollRightCursor,0);
  set_Xcursor(dsp,"\x01",7,0,&ScrollUpCursor,0);
  if (noscroll == 0) {
    uVar7 = CONCAT44(uVar9,dsp->InternalBorderWidth);
    WVar2 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,Col3,-dsp->InternalBorderWidth,
                                dsp->ScrollBarWidth,(dsp->Visible).height,uVar7,foregroundPixel,
                                backgroundPixel);
    uVar9 = (undefined4)((ulong)uVar7 >> 0x20);
    dsp->VerScrollBar = WVar2;
    XDefineCursor(dsp->display_id,dsp->VerScrollBar,VertScrollCursor);
    XMapWindow(dsp->display_id,dsp->VerScrollBar);
    uVar7 = CONCAT44(uVar9,dsp->InternalBorderWidth);
    WVar2 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,-dsp->InternalBorderWidth,Row3,
                                (dsp->Visible).width,dsp->ScrollBarWidth,uVar7,foregroundPixel,
                                backgroundPixel);
    uVar9 = (undefined4)((ulong)uVar7 >> 0x20);
    dsp->HorScrollBar = WVar2;
    XDefineCursor(dsp->display_id,dsp->HorScrollBar,HorizScrollCursor);
    XChangeWindowAttributes(dsp->display_id,dsp->HorScrollBar,0x200,&gcv.dash_offset);
    XMapWindow(dsp->display_id,dsp->HorScrollBar);
    uVar7 = CONCAT44(uVar9,dsp->InternalBorderWidth);
    WVar2 = XCreateSimpleWindow(dsp->display_id,dsp->VerScrollBar,-dsp->InternalBorderWidth,
                                (long)(int)((dsp->Visible).y * (dsp->Visible).height) /
                                (long)(int)(dsp->Display).height & 0xffffffff,dsp->ScrollBarWidth,
                                ((dsp->Visible).height * (dsp->Visible).height) /
                                (dsp->Display).height + 1,uVar7,foregroundPixel,backgroundPixel);
    uVar9 = (undefined4)((ulong)uVar7 >> 0x20);
    dsp->VerScrollButton = WVar2;
    XChangeWindowAttributes(dsp->display_id,dsp->VerScrollButton,0x200,&gcv.dash_offset);
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->VerScrollButton,dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id,dsp->VerScrollButton);
    XMapWindow(dsp->display_id,dsp->VerScrollButton);
    uVar7 = CONCAT44(uVar9,dsp->InternalBorderWidth);
    WVar2 = XCreateSimpleWindow(dsp->display_id,dsp->HorScrollBar,
                                (int)((dsp->Visible).x * (dsp->Visible).width) /
                                (int)(dsp->Display).width,-dsp->InternalBorderWidth,
                                ((dsp->Visible).width * (dsp->Visible).width) / (dsp->Display).width
                                + 1,dsp->ScrollBarWidth,uVar7,foregroundPixel,backgroundPixel);
    uVar9 = (undefined4)((ulong)uVar7 >> 0x20);
    dsp->HorScrollButton = WVar2;
    XChangeWindowAttributes(dsp->display_id,dsp->HorScrollButton,0x200,&gcv.dash_offset);
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->HorScrollButton,dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id,dsp->HorScrollButton);
    XMapWindow(dsp->display_id,dsp->HorScrollButton);
    uVar7 = CONCAT44(uVar9,dsp->InternalBorderWidth);
    WVar2 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,Col3,Row3,WT._4_4_,WT._4_4_,uVar7,
                                foregroundPixel,backgroundPixel);
    uVar9 = (undefined4)((ulong)uVar7 >> 0x20);
    dsp->NWGrav = WVar2;
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->NWGrav,dsp->GravityOnPixmap);
    XDefineCursor(dsp->display_id,dsp->NWGrav,DefaultCursor);
    XChangeWindowAttributes(dsp->display_id,dsp->NWGrav,0x200,&gcv.dash_offset);
    XClearWindow(dsp->display_id,dsp->NWGrav);
    XMapWindow(dsp->display_id,dsp->NWGrav);
    uVar7 = CONCAT44(uVar9,dsp->InternalBorderWidth);
    WVar2 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,GravSize,local_218,WT._4_4_,WT._4_4_
                                ,uVar7,foregroundPixel,backgroundPixel);
    uVar9 = (undefined4)((ulong)uVar7 >> 0x20);
    dsp->SEGrav = WVar2;
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->SEGrav,dsp->GravityOffPixmap);
    XDefineCursor(dsp->display_id,dsp->SEGrav,DefaultCursor);
    XChangeWindowAttributes(dsp->display_id,dsp->SEGrav,0x200,&gcv.dash_offset);
    XClearWindow(dsp->display_id,dsp->NWGrav);
    XMapWindow(dsp->display_id,dsp->SEGrav);
    uVar7 = CONCAT44(uVar9,dsp->InternalBorderWidth);
    WVar2 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,Col3,local_218,WT._4_4_,WT._4_4_,
                                uVar7,foregroundPixel,backgroundPixel);
    uVar9 = (undefined4)((ulong)uVar7 >> 0x20);
    dsp->SWGrav = WVar2;
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->SWGrav,dsp->GravityOffPixmap);
    XDefineCursor(dsp->display_id,dsp->SWGrav,DefaultCursor);
    XClearWindow(dsp->display_id,dsp->NWGrav);
    XMapWindow(dsp->display_id,dsp->SWGrav);
    WVar2 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,GravSize,Row3,WT._4_4_,WT._4_4_,
                                CONCAT44(uVar9,dsp->InternalBorderWidth),foregroundPixel,
                                backgroundPixel);
    dsp->NEGrav = WVar2;
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->NEGrav,dsp->GravityOffPixmap);
    XDefineCursor(dsp->display_id,dsp->NEGrav,DefaultCursor);
    XClearWindow(dsp->display_id,dsp->NWGrav);
    XMapWindow(dsp->display_id,dsp->NEGrav);
  }
  XMapWindow(dsp->display_id,dsp->LispWindow);
  XFlush(dsp->display_id);
  return;
}

Assistant:

void Create_LispWindow(DspInterface dsp)
{
  extern char foregroundColorName[];
  extern char backgroundColorName[];
  XColor foregroundColor_xcsd;
  XColor backgroundColor_xcsd;
  Status status;
  XSizeHints szhint = {0};
  XWMHints Lisp_WMhints = {0};
  XClassHint xclasshint = {0};
  XTextProperty IconText = {0}, WindowNameText = {0};
  XSetWindowAttributes Lisp_SetWinAttributes = {0};
  XGCValues gcv = {0};

  Screen *screen;

  unsigned int Col2, Row2, Col3, Row3;
  unsigned int GravSize;
  char *WT, *IT;

  WT = windowTitle;
  IT = iconTitle;

  GravSize = (dsp->ScrollBarWidth / 2) - dsp->InternalBorderWidth;
  Col2 = dsp->Visible.width;
  Row2 = dsp->Visible.height;
  Col3 = dsp->Visible.width + (OUTER_SB_WIDTH(dsp) / 2);
  Row3 = dsp->Visible.height + (OUTER_SB_WIDTH(dsp) / 2);

  screen = ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id));
  /* set up default display as black on white */
  foregroundPixel = BlackPixelOfScreen(screen); 
  backgroundPixel = WhitePixelOfScreen(screen);
  /* parse and record non-default color specs for foreground and background */
  if (foregroundColorName[0]) {
    status = XAllocNamedColor(dsp->display_id, Colors, foregroundColorName, &foregroundColor_xcsd, &foregroundColor_xcsd);
    if (status == 0) {
      fprintf(stderr, "Color allocation failed for foreground color: %s\n", foregroundColorName);
      exit(1);
    }
    foregroundPixel = foregroundColor_xcsd.pixel;
  }
  if (backgroundColorName[0]) {
    status = XAllocNamedColor(dsp->display_id, Colors, backgroundColorName, &backgroundColor_xcsd, &backgroundColor_xcsd);
    if (status == 0) {
      fprintf(stderr, "Color allocation failed for background color: %s\n", backgroundColorName);
      exit(1);
    }
    backgroundPixel = backgroundColor_xcsd.pixel;
  }
  dsp->LispWindow = XCreateSimpleWindow(
      dsp->display_id, RootWindowOfScreen(screen), LispWindowRequestedX, /* Default upper left */
      LispWindowRequestedY,                                              /* Default upper left */
      dsp->Visible.width + OUTER_SB_WIDTH(dsp),                         /* Default width */
      dsp->Visible.height + OUTER_SB_WIDTH(dsp),                        /* Default height */
      0,                                                                 /* Default border */
      foregroundPixel, backgroundPixel);

  Lisp_SetWinAttributes.bit_gravity = dsp->BitGravity;
  Lisp_SetWinAttributes.override_redirect = False;
  Lisp_SetWinAttributes.backing_store = DoesBackingStore(screen);

  XChangeWindowAttributes(dsp->display_id, dsp->LispWindow, CWBitGravity | CWOverrideRedirect,
                          &Lisp_SetWinAttributes);

  dsp->DisableEventMask = NoEventMask;
  dsp->EnableEventMask = ButtonPressMask | ButtonReleaseMask | EnterWindowMask | LeaveWindowMask |
                         StructureNotifyMask | PointerMotionMask | ExposureMask | KeyPressMask |
                         KeyReleaseMask;

  /* Have to make the GC before we make the icon. */
  gcv.function = GXcopy;
  gcv.foreground = foregroundPixel;
  gcv.background = backgroundPixel;
  dsp->Copy_GC =
      XCreateGC(dsp->display_id, dsp->LispWindow, GCForeground | GCBackground | GCFunction, &gcv);

  szhint.max_width = (int)(dsp->Display.width + OUTER_SB_WIDTH(dsp));
  szhint.max_height = (int)(dsp->Display.height + OUTER_SB_WIDTH(dsp));
  szhint.min_width = (int)OUTER_SB_WIDTH(dsp);
  szhint.min_height = (int)OUTER_SB_WIDTH(dsp);
  szhint.win_gravity = dsp->BitGravity;
  szhint.flags = PMaxSize | PWinGravity | PSize;

  Lisp_WMhints.icon_pixmap = make_Xicon(dsp);
  Lisp_WMhints.input = True;
  Lisp_WMhints.flags = IconPixmapHint | InputHint;

  xclasshint.res_name = *save_argv;
  xclasshint.res_class = *save_argv;

  XStringListToTextProperty(&WT, 1, &WindowNameText);
  XStringListToTextProperty(&IT, 1, &IconText);

  XSetWMProperties(dsp->display_id, dsp->LispWindow, &WindowNameText, &IconText, save_argv,
                   save_argc, &szhint, &Lisp_WMhints, &xclasshint);

  XSelectInput(dsp->display_id, dsp->LispWindow, dsp->EnableEventMask);
  init_Xcursor(dsp);

  dsp->DisplayWindow = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, 0, 0,
                                           dsp->Visible.width, dsp->Visible.height, 0,
                                           foregroundPixel, backgroundPixel);
  XChangeWindowAttributes(dsp->display_id, dsp->DisplayWindow,
                          CWBitGravity | CWOverrideRedirect | CWBackingStore,
                          &Lisp_SetWinAttributes);
  XSelectInput(dsp->display_id, dsp->DisplayWindow, dsp->EnableEventMask);
  XMapWindow(dsp->display_id, dsp->DisplayWindow);

  /*********************************************************************/
  /* Create all the vanilla pixmaps and cursors for the display window */
  /*********************************************************************/

  dsp->ScrollBarPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)check_bits, check_width, check_height,
      foregroundPixel, backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));
  dsp->GravityOnPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)check_bits, 16, 16, foregroundPixel,
      backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));

  dsp->GravityOffPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)plain_bits, 16, 16, foregroundPixel,
      backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));

  set_Xcursor(dsp, default_cursor.cuimage, (int)default_cursor.cuhotspotx,
              (int)(15 - default_cursor.cuhotspoty), &DefaultCursor, 0);
  set_Xcursor(dsp, wait_cursor.cuimage, (int)wait_cursor.cuhotspotx,
              (int)(15 - wait_cursor.cuhotspoty), &WaitCursor, 0);
  set_Xcursor(dsp, scrolldown_cursor.cuimage, (int)scrolldown_cursor.cuhotspotx,
              (int)(15 - scrolldown_cursor.cuhotspoty), &ScrollDownCursor, 0);
  set_Xcursor(dsp, scrollleft_cursor.cuimage, (int)scrollleft_cursor.cuhotspotx,
              (int)(15 - scrollleft_cursor.cuhotspoty), &ScrollLeftCursor, 0);
  set_Xcursor(dsp, vertscroll_cursor.cuimage, (int)vertscroll_cursor.cuhotspotx,
              (int)(15 - vertscroll_cursor.cuhotspoty), &VertScrollCursor, 0);
  set_Xcursor(dsp, vertthumb_cursor.cuimage, (int)vertthumb_cursor.cuhotspotx,
              (int)(15 - vertthumb_cursor.cuhotspoty), &VertThumbCursor, 0);
  set_Xcursor(dsp, horizscroll_cursor.cuimage, (int)horizscroll_cursor.cuhotspotx,
              (int)(15 - horizscroll_cursor.cuhotspoty), &HorizScrollCursor, 0);
  set_Xcursor(dsp, horizthumb_cursor.cuimage, (int)horizthumb_cursor.cuhotspotx,
              (int)(15 - horizthumb_cursor.cuhotspoty), &HorizThumbCursor, 0);
  set_Xcursor(dsp, scrollright_cursor.cuimage, (int)scrollright_cursor.cuhotspotx,
              (int)(15 - scrollright_cursor.cuhotspoty), &ScrollRightCursor, 0);
  set_Xcursor(dsp, scrollup_cursor.cuimage, (int)scrollup_cursor.cuhotspotx,
              (int)(15 - scrollup_cursor.cuhotspoty), &ScrollUpCursor, 0);

  if (noscroll == 0) {
    /********************************/
    /* Make all the toolkit windows */
    /********************************/
    dsp->VerScrollBar = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2,
                                            0 - (int)dsp->InternalBorderWidth, /* y */
                                            dsp->ScrollBarWidth,          /* width */
                                            dsp->Visible.height, dsp->InternalBorderWidth,
                                            foregroundPixel, backgroundPixel);
    DefineCursor(dsp, dsp->VerScrollBar, &VertScrollCursor);
    XMapWindow(dsp->display_id, dsp->VerScrollBar);

    dsp->HorScrollBar = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow,
                                            0 - (int)dsp->InternalBorderWidth, (int)Row2, /* y */
                                            dsp->Visible.width,                /* width */
                                            dsp->ScrollBarWidth, dsp->InternalBorderWidth,
                                            foregroundPixel, backgroundPixel);
    DefineCursor(dsp, dsp->HorScrollBar, &HorizScrollCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->HorScrollBar, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XMapWindow(dsp->display_id, dsp->HorScrollBar);

    dsp->VerScrollButton = XCreateSimpleWindow(
                                               dsp->display_id, dsp->VerScrollBar, 0 - (int)dsp->InternalBorderWidth,      /* x */
                                               (dsp->Visible.y * (int)dsp->Visible.height) / (int)dsp->Display.height, /* y */
                                               dsp->ScrollBarWidth,                                                   /* width */
                                               ((dsp->Visible.height * dsp->Visible.height) / dsp->Display.height) + 1,
                                               dsp->InternalBorderWidth, foregroundPixel, backgroundPixel);
    XChangeWindowAttributes(dsp->display_id, dsp->VerScrollButton, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->VerScrollButton, dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id, dsp->VerScrollButton);
    XMapWindow(dsp->display_id, dsp->VerScrollButton);

    dsp->HorScrollButton = XCreateSimpleWindow(
                                               dsp->display_id, dsp->HorScrollBar,
                                               (dsp->Visible.x * (int)dsp->Visible.width) / (int)dsp->Display.width,
                                               0 - (int)dsp->InternalBorderWidth, /* y */
                                               ((dsp->Visible.width * dsp->Visible.width) / dsp->Display.width) + 1,
                                               dsp->ScrollBarWidth, dsp->InternalBorderWidth, foregroundPixel,
                                               backgroundPixel);
    XChangeWindowAttributes(dsp->display_id, dsp->HorScrollButton, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->HorScrollButton, dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id, dsp->HorScrollButton);
    XMapWindow(dsp->display_id, dsp->HorScrollButton);

    dsp->NWGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2, (int)Row2, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->NWGrav, dsp->GravityOnPixmap);
    DefineCursor(dsp, dsp->NWGrav, &DefaultCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->NWGrav, CWOverrideRedirect, &Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->NWGrav);

    dsp->SEGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col3, (int)Row3, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->SEGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->SEGrav, &DefaultCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->SEGrav, CWOverrideRedirect, &Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->SEGrav);

    dsp->SWGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2, (int)Row3, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->SWGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->SWGrav, &DefaultCursor);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->SWGrav);

    dsp->NEGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col3, (int)Row2, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->NEGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->NEGrav, &DefaultCursor);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->NEGrav);
  }
  /* DefineCursor( dsp, dsp->DisplayWindow, &WaitCursor ); */

  XLOCK;
  XMapWindow(dsp->display_id, dsp->LispWindow);
  XFlush(dsp->display_id);
  XUNLOCK(dsp);
}